

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O1

void __thiscall
QMessageAuthenticationCodePrivate::setKey
          (QMessageAuthenticationCodePrivate *this,QByteArrayView newKey)

{
  QCryptographicHashPrivate *this_00;
  HashResult *result;
  byte bVar1;
  Algorithm method;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t otherSize;
  
  uVar3 = (ulong)(this->messageHash).method;
  if (uVar3 < 0x17) {
    uVar3 = *(ulong *)(&DAT_0058d360 + uVar3 * 8);
  }
  else {
    uVar3 = 0;
  }
  if ((long)uVar3 < newKey.m_size) {
    this_00 = &this->messageHash;
    QCryptographicHashPrivate::State::addData((State *)this_00,(this->messageHash).method,newKey);
    (this->messageHash).result.m_size = '\0';
    result = &(this->messageHash).result;
    method = (this->messageHash).method;
    iVar2 = hashLengthInternal(method);
    (this->messageHash).result.m_size = (quint8)iVar2;
    QCryptographicHashPrivate::State::finalizeUnchecked((State *)this_00,method,result);
    bVar1 = (this->messageHash).result.m_size;
    memcpy(this,result,(ulong)bVar1);
    (this->key).m_size = bVar1;
    (this->messageHash).result.m_size = '\0';
    QCryptographicHashPrivate::State::reset((State *)this_00,(this->messageHash).method);
  }
  else {
    memcpy(this,newKey.m_data,newKey.m_size);
    (this->key).m_size = (quint8)newKey.m_size;
  }
  uVar4 = (ulong)(this->key).m_size;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    (this->key).m_size = (quint8)uVar3;
    memset((this->key).m_data._M_elems + uVar4,0,uVar3 - uVar4);
  }
  initMessageHash(this);
  return;
}

Assistant:

void QMessageAuthenticationCodePrivate::setKey(QByteArrayView newKey) noexcept
{
    const int blockSize = qt_hash_block_size(messageHash.method);

    if (newKey.size() > blockSize) {
        messageHash.addData(newKey);
        messageHash.finalizeUnchecked();
        static_assert([] {
                using A = QCryptographicHash::Algorithm;
                for (int i = 0; i < A::NumAlgorithms; ++i) {
                    if (hashLengthInternal(A(i)) > qt_hash_block_size(A(i)))
                        return false;
                }
                return true;
            }(), "this code assumes that a hash's result always fits into that hash's block size");
        key = messageHash.result;
        messageHash.reset();
    } else {
        key.assign(newKey);
    }

    if (key.size() < blockSize)
        key.resize(blockSize, '\0');

    initMessageHash();
}